

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::LipidTransVisitor::internalVisit(LipidTransVisitor *this,StuntDouble *sd)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *v1;
  Vector<double,_3U> *in_RSI;
  shared_ptr<OpenMD::GenericData> *in_RDI;
  Vector3d tmp;
  Snapshot *currSnapshot;
  iterator i;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  Vector<double,_3U> *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  StuntDouble *in_stack_fffffffffffffea8;
  Vector<double,_3U> *v;
  AtomData *this_01;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  Vector3d *in_stack_ffffffffffffff18;
  Snapshot *in_stack_ffffffffffffff20;
  undefined1 local_79 [49];
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  local_48;
  __shared_ptr local_40 [48];
  Vector<double,_3U> *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34ae21);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34ae2e);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34ae3b);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator(&local_48);
  this_01 = (AtomData *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffea0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe98);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34aec0);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_RDI);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe98);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34af2b);
    bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98);
    if (!bVar1) {
      this_00 = SimInfo::getSnapshotManager
                          ((SimInfo *)
                           in_RDI[2].
                           super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
      v1 = SnapshotManager::getCurrentSnapshot(this_00);
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34afed);
      AtomData::beginAtomInfo(this_01,(iterator *)local_10);
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffea0,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe98);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b029);
      v = local_10;
      while (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40), bVar1) {
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b04c);
        OpenMD::operator-((Vector<double,_3U> *)v1,(Vector<double,_3U> *)in_stack_fffffffffffffea0);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        Snapshot::wrapVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)this_01,v);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b0c3);
        Vector3<double>::operator=
                  ((Vector3<double> *)v1,(Vector<double,_3U> *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea0 = (string *)(in_RDI + 199);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b0f3);
        OpenMD::operator*((RectMatrix<double,_3U,_3U> *)this_01,v);
        std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b118);
        Vector3<double>::operator=
                  ((Vector3<double> *)v1,(Vector<double,_3U> *)in_stack_fffffffffffffea0);
        std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x34b13a);
        AtomData::nextAtomInfo(this_01,(iterator *)v);
        std::shared_ptr<OpenMD::AtomInfo>::operator=
                  ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffea0,
                   (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe98);
        std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b16d);
      }
    }
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34b1a0);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34b1ad);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34b1ba);
  return;
}

Assistant:

void LipidTransVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d tmp = atomInfo->pos - origin_;
      currSnapshot->wrapVector(tmp);
      atomInfo->pos = rotMat_ * tmp;
      ;
      atomInfo->vec = rotMat_ * atomInfo->vec;
    }
  }